

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O0

int Fx_ManDivRemoveLits(Vec_Int_t *vCube,Vec_Int_t *vDiv,int fCompl)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  bool local_31;
  int local_28;
  int Count;
  int Lit;
  int i;
  int fCompl_local;
  Vec_Int_t *vDiv_local;
  Vec_Int_t *vCube_local;
  
  local_28 = 0;
  if ((fCompl != 0) && (iVar1 = Vec_IntSize(vDiv), iVar1 != 4)) {
    __assert_fail("!fCompl || Vec_IntSize(vDiv) == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcFx.c"
                  ,0x29e,"int Fx_ManDivRemoveLits(Vec_Int_t *, Vec_Int_t *, int)");
  }
  for (Count = 0; iVar1 = Vec_IntSize(vDiv), Count < iVar1; Count = Count + 1) {
    iVar1 = Vec_IntEntry(vDiv,Count);
    uVar2 = Abc_Lit2Var(iVar1);
    local_31 = fCompl != 0 && 1 < Count;
    iVar3 = Vec_IntRemove1(vCube,uVar2 ^ local_31);
    local_28 = iVar3 + local_28;
    iVar3 = Vec_IntSize(vDiv);
    if (iVar3 == 2) {
      iVar1 = Abc_Lit2Var(iVar1);
      iVar1 = Abc_LitNot(iVar1);
      iVar1 = Vec_IntRemove1(vCube,iVar1);
      local_28 = iVar1 + local_28;
    }
  }
  return local_28;
}

Assistant:

static inline int Fx_ManDivRemoveLits( Vec_Int_t * vCube, Vec_Int_t * vDiv, int fCompl )
{
    int i, Lit, Count = 0;
    assert( !fCompl || Vec_IntSize(vDiv) == 4 );
    Vec_IntForEachEntry( vDiv, Lit, i )
    {
        Count += Vec_IntRemove1( vCube, Abc_Lit2Var(Lit) ^ (fCompl && i > 1) );  // the last two lits can be complemented
        if ( Vec_IntSize( vDiv ) == 2 )
            Count += Vec_IntRemove1( vCube, Abc_LitNot( Abc_Lit2Var(Lit) ) );
    }
    return Count;
}